

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::initializePipelineStack(QPDFWriter *this,Pipeline *p)

{
  element_type *peVar1;
  Count *this_00;
  __shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  this_00 = (Count *)operator_new(0x58);
  ::qpdf::pl::Count::Count(this_00,1,p);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->pipeline = this_00;
  std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<qpdf::pl::Count,void>
            (local_30,this_00);
  std::__cxx11::list<std::shared_ptr<Pipeline>,std::allocator<std::shared_ptr<Pipeline>>>::
  emplace_back<std::shared_ptr<Pipeline>>
            ((list<std::shared_ptr<Pipeline>,std::allocator<std::shared_ptr<Pipeline>>> *)
             &peVar1->to_delete,(shared_ptr<Pipeline> *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<Pipeline*,std::allocator<Pipeline*>>::emplace_back<qpdf::pl::Count*&>
            ((vector<Pipeline*,std::allocator<Pipeline*>> *)&peVar1->pipeline_stack,
             &peVar1->pipeline);
  return;
}

Assistant:

void
QPDFWriter::initializePipelineStack(Pipeline* p)
{
    m->pipeline = new pl::Count(1, p);
    m->to_delete.emplace_back(std::shared_ptr<Pipeline>(m->pipeline));
    m->pipeline_stack.emplace_back(m->pipeline);
}